

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDynamicLibrary.cpp
# Opt level: O1

void __thiscall de::DynamicLibrary::DynamicLibrary(DynamicLibrary *this,char *fileName)

{
  deDynamicLibrary *pdVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->m_library = (deDynamicLibrary *)0x0;
  pdVar1 = deDynamicLibrary_open(fileName);
  this->m_library = pdVar1;
  if (pdVar1 != (deDynamicLibrary *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to open dynamic library: \'","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  local_90 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_90 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_70 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_70);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DynamicLibrary::DynamicLibrary (const char* fileName)
	: m_library(DE_NULL)
{
	m_library = deDynamicLibrary_open(fileName);
	if (!m_library)
		throw std::runtime_error(std::string("Failed to open dynamic library: '") + fileName + "'");
}